

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O3

void __thiscall capnp::compiler::Compiler::clearWorkspace(Compiler *this)

{
  kj::_::Mutex::lock(&(this->impl).mutex,EXCLUSIVE);
  Impl::clearWorkspace((this->impl).value.ptr);
  kj::_::Mutex::unlock(&(this->impl).mutex,EXCLUSIVE);
  return;
}

Assistant:

void Compiler::clearWorkspace() const {
  impl.lockExclusive()->get()->clearWorkspace();
}